

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::DebugNodeTable(ImGuiTable *table)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  char *pcVar13;
  ImVec4 *col;
  ImDrawList *pIVar14;
  long lVar15;
  char *pcVar16;
  ImGuiTableSettings *settings;
  ImGuiTableColumn *p;
  ImGuiTableColumn *pIVar17;
  char *pcVar18;
  ulong uVar19;
  char *pcVar20;
  char *pcVar21;
  double dVar22;
  ImRect r;
  char buf [512];
  float local_28c;
  ImVec2 local_288;
  ImVec2 local_280;
  uint local_274;
  uint local_270;
  uint local_26c;
  uint local_268;
  uint local_264;
  ImGuiTable *local_260;
  double local_258;
  double local_250;
  char *local_248;
  ImVec2 local_240;
  char local_238 [520];
  
  iVar7 = table->LastFrameActive;
  iVar11 = GetFrameCount();
  iVar11 = iVar11 + -2;
  pcVar13 = " *Inactive*";
  if (iVar11 <= iVar7) {
    pcVar13 = "";
  }
  ImFormatString(local_238,0x200,"Table 0x%08X (%d columns, in \'%s\')%s",(ulong)table->ID,
                 (ulong)(uint)table->ColumnsCount,table->OuterWindow->Name,pcVar13);
  if (iVar7 < iVar11) {
    col = GetStyleColorVec4(1);
    PushStyleColor(0,col);
  }
  bVar8 = TreeNode(table,"%s",local_238);
  if (iVar7 < iVar11) {
    PopStyleColor(1);
  }
  bVar9 = IsItemHovered(0);
  if (bVar9) {
    pIVar14 = GetForegroundDrawList();
    ImDrawList::AddRect(pIVar14,&(table->OuterRect).Min,&(table->OuterRect).Max,0xff00ffff,0.0,0,1.0
                       );
  }
  bVar9 = IsItemVisible();
  if ((bVar9) && (table->HoveredColumnBody != -1)) {
    pIVar14 = GetForegroundDrawList();
    local_288 = GetItemRectMin();
    local_240 = GetItemRectMax();
    ImDrawList::AddRect(pIVar14,&local_288,&local_240,0xff00ffff,0.0,0,1.0);
  }
  if (bVar8) {
    if (0 < table->InstanceCurrent) {
      Text("** %d instances of same table! Some data below will refer to last instance.",
           (ulong)((ushort)table->InstanceCurrent + 1));
    }
    bVar8 = SmallButton("Clear settings");
    fVar1 = (table->OuterRect).Min.x;
    fVar2 = (table->OuterRect).Min.y;
    uVar12 = (table->Flags & 0xe000U) - 0x2000;
    if (uVar12 < 0x8000) {
      pcVar13 = &DAT_001cdbe0 + *(int *)(&DAT_001cdbe0 + (uVar12 >> 0xb));
    }
    else {
      pcVar13 = "N/A";
    }
    BulletText("OuterRect: Pos: (%.1f,%.1f) Size: (%.1f,%.1f) Sizing: \'%s\'",(double)fVar1,
               (double)fVar2,(double)((table->OuterRect).Max.x - fVar1),
               (double)((table->OuterRect).Max.y - fVar2),pcVar13);
    fVar1 = table->InnerWidth;
    local_28c = 0.0;
    pcVar13 = " (auto)";
    if (fVar1 != 0.0) {
      pcVar13 = "";
    }
    if (NAN(fVar1)) {
      pcVar13 = "";
    }
    BulletText("ColumnsGivenWidth: %.1f, ColumnsAutoFitWidth: %.1f, InnerWidth: %.1f%s",
               (double)table->ColumnsGivenWidth,(double)table->ColumnsAutoFitWidth,(double)fVar1,
               pcVar13);
    BulletText("CellPaddingX: %.1f, CellSpacingX: %.1f/%.1f, OuterPaddingX: %.1f",
               (double)table->CellPaddingX,(double)table->CellSpacingX1,(double)table->CellSpacingX2
               ,(double)table->OuterPaddingX);
    BulletText("HoveredColumnBody: %d, HoveredColumnBorder: %d",
               (ulong)(uint)(int)table->HoveredColumnBody,
               (ulong)(uint)(int)table->HoveredColumnBorder);
    BulletText("ResizedColumn: %d, ReorderColumn: %d, HeldHeaderColumn: %d",
               (ulong)(uint)(int)table->ResizedColumn,(ulong)(uint)(int)table->ReorderColumn,
               (ulong)(uint)(int)table->HeldHeaderColumn);
    lVar15 = (long)table->ColumnsCount;
    if (0 < lVar15) {
      pIVar17 = (table->Columns).Data;
      local_28c = 0.0;
      do {
        if ((table->Columns).DataEnd <= pIVar17) goto LAB_0019eabc;
        if ((pIVar17->Flags & 8) != 0) {
          local_28c = local_28c + pIVar17->StretchWeight;
        }
        pIVar17 = pIVar17 + 1;
        lVar15 = lVar15 + -1;
      } while (lVar15 != 0);
    }
    if (0 < table->ColumnsCount) {
      lVar15 = 0;
      uVar19 = 0;
      local_260 = table;
      do {
        pIVar17 = (table->Columns).Data;
        if ((table->Columns).DataEnd <= (ImGuiTableColumn *)((long)&pIVar17->Flags + lVar15)) {
LAB_0019eabc:
          __assert_fail("p >= Data && p < DataEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui_internal.h"
                        ,0x255,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]"
                       );
        }
        local_248 = TableGetColumnName(table,(int)uVar19);
        fVar1 = *(float *)((long)&pIVar17->MinX + lVar15);
        fVar2 = (table->WorkRect).Min.x;
        local_250 = (double)(fVar1 - fVar2);
        fVar3 = *(float *)((long)&pIVar17->MaxX + lVar15);
        local_258 = (double)(fVar3 - fVar2);
        pcVar13 = "";
        if ((long)uVar19 < (long)table->FreezeColumnsRequest) {
          pcVar13 = " (Frozen)";
        }
        fVar2 = *(float *)((long)&pIVar17->StretchWeight + lVar15);
        if (0.0 < fVar2) {
          dVar22 = (double)((fVar2 / local_28c) * 100.0);
        }
        else {
          dVar22 = 0.0;
        }
        local_264 = (uint)(&pIVar17->DisplayOrder)[lVar15];
        local_268 = (uint)(&pIVar17->IsEnabled)[lVar15];
        local_26c = (uint)(&pIVar17->IsVisibleX)[lVar15];
        local_270 = (uint)(&pIVar17->IsVisibleY)[lVar15];
        local_274 = (uint)(&pIVar17->IsRequestOutput)[lVar15];
        fVar4 = *(float *)((long)&(pIVar17->ClipRect).Min.x + lVar15);
        fVar5 = *(float *)((long)&(pIVar17->ClipRect).Max.x + lVar15);
        fVar6 = *(float *)((long)&pIVar17->WorkMinX + lVar15);
        bVar10 = (&pIVar17->field_0x65)[lVar15] & 3;
        pcVar21 = "";
        if (bVar10 == 2) {
          pcVar21 = " (Des)";
        }
        if (bVar10 == 1) {
          pcVar21 = " (Asc)";
        }
        uVar12 = *(uint *)((long)&pIVar17->Flags + lVar15);
        pcVar18 = "WidthStretch ";
        if ((uVar12 & 8) == 0) {
          pcVar18 = "";
        }
        pcVar16 = "WidthFixed ";
        if ((uVar12 & 0x10) == 0) {
          pcVar16 = "";
        }
        pcVar20 = "NoResize ";
        if ((uVar12 & 0x20) == 0) {
          pcVar20 = "";
        }
        ImFormatString(local_238,0x200,
                       "Column %d order %d \'%s\': offset %+.2f to %+.2f%s\nEnabled: %d, VisibleX/Y: %d/%d, RequestOutput: %d, SkipItems: %d, DrawChannels: %d,%d\nWidthGiven: %.1f, Request/Auto: %.1f/%.1f, StretchWeight: %.3f (%.1f%%)\nMinX: %.1f, MaxX: %.1f (%+.1f), ClipRect: %.1f to %.1f (+%.1f)\nContentWidth: %.1f,%.1f, HeadersUsed/Ideal %.1f/%.1f\nSort: %d%s, UserID: 0x%08X, Flags: 0x%04X: %s%s%s.."
                       ,local_250,local_258,(double)*(float *)((long)&pIVar17->WidthGiven + lVar15),
                       (double)*(float *)((long)&pIVar17->WidthRequest + lVar15),
                       (double)*(float *)((long)&pIVar17->WidthAuto + lVar15),(double)fVar2,dVar22,
                       (double)fVar1,uVar19 & 0xffffffff,(ulong)local_264,local_248,pcVar13,
                       local_268,local_26c,local_270,local_274,(uint)(&pIVar17->IsSkipItems)[lVar15]
                       ,(uint)(&pIVar17->DrawChannelFrozen)[lVar15],
                       (uint)(&pIVar17->DrawChannelUnfrozen)[lVar15],(double)fVar3,
                       (double)(fVar3 - fVar1),(double)fVar4,(double)fVar5,(double)(fVar5 - fVar4),
                       (double)(*(float *)((long)&pIVar17->ContentMaxXFrozen + lVar15) - fVar6),
                       (double)(*(float *)((long)&pIVar17->ContentMaxXUnfrozen + lVar15) - fVar6),
                       (double)(*(float *)((long)&pIVar17->ContentMaxXHeadersUsed + lVar15) - fVar6)
                       ,(double)(*(float *)((long)&pIVar17->ContentMaxXHeadersIdeal + lVar15) -
                                fVar6),(int)(&pIVar17->SortOrder)[lVar15],pcVar21,
                       *(undefined4 *)((long)&pIVar17->UserID + lVar15),uVar12,pcVar18,pcVar16,
                       pcVar20);
        Bullet();
        local_288.x = 0.0;
        local_288.y = 0.0;
        Selectable(local_238,false,0,&local_288);
        bVar9 = IsItemHovered(0);
        table = local_260;
        if (bVar9) {
          local_280.x = *(float *)((long)&pIVar17->MaxX + lVar15);
          local_280.y = (local_260->OuterRect).Max.y;
          local_288.y = (local_260->OuterRect).Min.y;
          local_288.x = *(float *)((long)&pIVar17->MinX + lVar15);
          pIVar14 = GetForegroundDrawList();
          ImDrawList::AddRect(pIVar14,&local_288,&local_280,0xff00ffff,0.0,0,1.0);
        }
        uVar19 = uVar19 + 1;
        lVar15 = lVar15 + 0x68;
      } while ((long)uVar19 < (long)table->ColumnsCount);
    }
    settings = TableGetBoundSettings(table);
    if (settings != (ImGuiTableSettings *)0x0) {
      DebugNodeTableSettings(settings);
    }
    if (bVar8) {
      table->IsResetAllRequest = true;
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeTable(ImGuiTable* table)
{
    char buf[512];
    char* p = buf;
    const char* buf_end = buf + IM_ARRAYSIZE(buf);
    const bool is_active = (table->LastFrameActive >= ImGui::GetFrameCount() - 2); // Note that fully clipped early out scrolling tables will appear as inactive here.
    ImFormatString(p, buf_end - p, "Table 0x%08X (%d columns, in '%s')%s", table->ID, table->ColumnsCount, table->OuterWindow->Name, is_active ? "" : " *Inactive*");
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    bool open = TreeNode(table, "%s", buf);
    if (!is_active) { PopStyleColor(); }
    if (IsItemHovered())
        GetForegroundDrawList()->AddRect(table->OuterRect.Min, table->OuterRect.Max, IM_COL32(255, 255, 0, 255));
    if (IsItemVisible() && table->HoveredColumnBody != -1)
        GetForegroundDrawList()->AddRect(GetItemRectMin(), GetItemRectMax(), IM_COL32(255, 255, 0, 255));
    if (!open)
        return;
    if (table->InstanceCurrent > 0)
        ImGui::Text("** %d instances of same table! Some data below will refer to last instance.", table->InstanceCurrent + 1);
    bool clear_settings = SmallButton("Clear settings");
    BulletText("OuterRect: Pos: (%.1f,%.1f) Size: (%.1f,%.1f) Sizing: '%s'", table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.GetWidth(), table->OuterRect.GetHeight(), DebugNodeTableGetSizingPolicyDesc(table->Flags));
    BulletText("ColumnsGivenWidth: %.1f, ColumnsAutoFitWidth: %.1f, InnerWidth: %.1f%s", table->ColumnsGivenWidth, table->ColumnsAutoFitWidth, table->InnerWidth, table->InnerWidth == 0.0f ? " (auto)" : "");
    BulletText("CellPaddingX: %.1f, CellSpacingX: %.1f/%.1f, OuterPaddingX: %.1f", table->CellPaddingX, table->CellSpacingX1, table->CellSpacingX2, table->OuterPaddingX);
    BulletText("HoveredColumnBody: %d, HoveredColumnBorder: %d", table->HoveredColumnBody, table->HoveredColumnBorder);
    BulletText("ResizedColumn: %d, ReorderColumn: %d, HeldHeaderColumn: %d", table->ResizedColumn, table->ReorderColumn, table->HeldHeaderColumn);
    //BulletText("BgDrawChannels: %d/%d", 0, table->BgDrawChannelUnfrozen);
    float sum_weights = 0.0f;
    for (int n = 0; n < table->ColumnsCount; n++)
        if (table->Columns[n].Flags & ImGuiTableColumnFlags_WidthStretch)
            sum_weights += table->Columns[n].StretchWeight;
    for (int n = 0; n < table->ColumnsCount; n++)
    {
        ImGuiTableColumn* column = &table->Columns[n];
        const char* name = TableGetColumnName(table, n);
        ImFormatString(buf, IM_ARRAYSIZE(buf),
            "Column %d order %d '%s': offset %+.2f to %+.2f%s\n"
            "Enabled: %d, VisibleX/Y: %d/%d, RequestOutput: %d, SkipItems: %d, DrawChannels: %d,%d\n"
            "WidthGiven: %.1f, Request/Auto: %.1f/%.1f, StretchWeight: %.3f (%.1f%%)\n"
            "MinX: %.1f, MaxX: %.1f (%+.1f), ClipRect: %.1f to %.1f (+%.1f)\n"
            "ContentWidth: %.1f,%.1f, HeadersUsed/Ideal %.1f/%.1f\n"
            "Sort: %d%s, UserID: 0x%08X, Flags: 0x%04X: %s%s%s..",
            n, column->DisplayOrder, name, column->MinX - table->WorkRect.Min.x, column->MaxX - table->WorkRect.Min.x, (n < table->FreezeColumnsRequest) ? " (Frozen)" : "",
            column->IsEnabled, column->IsVisibleX, column->IsVisibleY, column->IsRequestOutput, column->IsSkipItems, column->DrawChannelFrozen, column->DrawChannelUnfrozen,
            column->WidthGiven, column->WidthRequest, column->WidthAuto, column->StretchWeight, column->StretchWeight > 0.0f ? (column->StretchWeight / sum_weights) * 100.0f : 0.0f,
            column->MinX, column->MaxX, column->MaxX - column->MinX, column->ClipRect.Min.x, column->ClipRect.Max.x, column->ClipRect.Max.x - column->ClipRect.Min.x,
            column->ContentMaxXFrozen - column->WorkMinX, column->ContentMaxXUnfrozen - column->WorkMinX, column->ContentMaxXHeadersUsed - column->WorkMinX, column->ContentMaxXHeadersIdeal - column->WorkMinX,
            column->SortOrder, (column->SortDirection == ImGuiSortDirection_Ascending) ? " (Asc)" : (column->SortDirection == ImGuiSortDirection_Descending) ? " (Des)" : "", column->UserID, column->Flags,
            (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? "WidthStretch " : "",
            (column->Flags & ImGuiTableColumnFlags_WidthFixed) ? "WidthFixed " : "",
            (column->Flags & ImGuiTableColumnFlags_NoResize) ? "NoResize " : "");
        Bullet();
        Selectable(buf);
        if (IsItemHovered())
        {
            ImRect r(column->MinX, table->OuterRect.Min.y, column->MaxX, table->OuterRect.Max.y);
            GetForegroundDrawList()->AddRect(r.Min, r.Max, IM_COL32(255, 255, 0, 255));
        }
    }
    if (ImGuiTableSettings* settings = TableGetBoundSettings(table))
        DebugNodeTableSettings(settings);
    if (clear_settings)
        table->IsResetAllRequest = true;
    TreePop();
}